

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void record_samples(MB_MODE_INFO *mbmi,int *pts,int *pts_inref,int row_offset,int sign_r,
                   int col_offset,int sign_c)

{
  byte bVar1;
  int y;
  int x;
  int bh;
  int bw;
  int col_offset_local;
  int sign_r_local;
  int row_offset_local;
  int *pts_inref_local;
  int *pts_local;
  MB_MODE_INFO *mbmi_local;
  
  bVar1 = block_size_high[mbmi->bsize];
  *pts = (col_offset * 4 + (int)(sign_c * (uint)block_size_wide[mbmi->bsize]) / 2 + -1) * 8;
  pts[1] = (row_offset * 4 + (int)(sign_r * (uint)bVar1) / 2 + -1) * 8;
  *pts_inref = *pts + (int)mbmi->mv[0].as_mv.col;
  pts_inref[1] = pts[1] + (int)mbmi->mv[0].as_mv.row;
  return;
}

Assistant:

static inline void record_samples(const MB_MODE_INFO *mbmi, int *pts,
                                  int *pts_inref, int row_offset, int sign_r,
                                  int col_offset, int sign_c) {
  const int bw = block_size_wide[mbmi->bsize];
  const int bh = block_size_high[mbmi->bsize];
  const int x = col_offset * MI_SIZE + sign_c * bw / 2 - 1;
  const int y = row_offset * MI_SIZE + sign_r * bh / 2 - 1;

  pts[0] = GET_MV_SUBPEL(x);
  pts[1] = GET_MV_SUBPEL(y);
  pts_inref[0] = pts[0] + mbmi->mv[0].as_mv.col;
  pts_inref[1] = pts[1] + mbmi->mv[0].as_mv.row;
}